

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O3

float __thiscall FileReader::next(FileReader *this)

{
  BufferReader *this_00;
  pointer pcVar1;
  bool bVar2;
  runtime_error *this_01;
  size_type __n;
  float fVar3;
  vector<char,_std::allocator<char>_> data;
  allocator_type local_59;
  BufferReader local_58;
  vector<char,_std::allocator<char>_> local_30;
  
  bVar2 = isEmpty(this);
  if (bVar2) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Empty file!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->buffer;
  bVar2 = BufferReader::isEmpty(this_00);
  if (bVar2) {
    __n = this->size - this->offset;
    if (0x7ffff < __n) {
      __n = 0x80000;
    }
    local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_58.data.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_30,__n,(value_type *)&local_58,&local_59);
    std::istream::read((char *)&this->file,
                       (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    BufferReader::BufferReader(&local_58,&local_30);
    pcVar1 = (this->buffer).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->buffer).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->buffer).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->buffer).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pcVar1 == (pointer)0x0) {
      (this->buffer).offset = local_58.offset;
    }
    else {
      operator_delete(pcVar1);
      (this->buffer).offset = local_58.offset;
      if (local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  bVar2 = BufferReader::isEmpty(this_00);
  if (!bVar2) {
    this->offset = this->offset + 4;
    fVar3 = BufferReader::next(this_00);
    return fVar3;
  }
  __assert_fail("!buffer.isEmpty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/file_reader.cpp"
                ,0x38,"float FileReader::next()");
}

Assistant:

float FileReader::next()
{
	if (isEmpty()) {
		throw std::runtime_error("Empty file!");
	}
	if (buffer.isEmpty()) {
		size_t buffer_size = std::min(BYTES_PER_BUFFER, size - offset);
		std::vector<char> data(buffer_size, 0);
		file.read(data.data(), buffer_size);
		buffer = BufferReader(data);
	}
	assert(!buffer.isEmpty());
	offset += sizeof(float);
	return buffer.next();
}